

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_crypt.c
# Opt level: O2

void gf64_mul(uint64_t *result,uint64_t *arg1,uint64_t *arg2)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  bool bVar6;
  
  uVar3 = *arg1;
  uVar2 = *arg2;
  uVar2 = uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
          (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
          (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
  iVar4 = 0x3f;
  uVar5 = 0;
  uVar3 = uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
          (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
          (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
  while( true ) {
    uVar5 = -(ulong)((uint)uVar2 & 1) & uVar3 ^ uVar5;
    bVar6 = iVar4 == 0;
    iVar4 = iVar4 + -1;
    if (bVar6) break;
    uVar2 = uVar2 >> 1;
    uVar1 = uVar3 * 2;
    bVar6 = -1 < (long)uVar3;
    uVar3 = uVar1 ^ 0x1b;
    if (bVar6) {
      uVar3 = uVar1;
    }
  }
  *result = uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 | (uVar5 & 0xff0000000000) >> 0x18 |
            (uVar5 & 0xff00000000) >> 8 | (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 |
            (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38;
  return;
}

Assistant:

static void gf64_mul (uint64_t *result, uint64_t *arg1, uint64_t *arg2)
{
	int i = 0;
	register uint64_t t, X0;
	uint64_t Z0 = 0;

#ifdef L_ENDIAN
	X0 = BSWAP64(*arg1);
#else
	X0 = *arg1;
#endif

#ifdef L_ENDIAN
	t = BSWAP64(*(arg2));
#else
	t = *(arg2);
#endif

	for (i = 0; i < 63; i++) {
		if (t & 0x1) {
			Z0 ^= X0;
		}
		t >>= 1;
		if (X0 & 0x8000000000000000) {
			X0 <<= 1;
			X0 ^= 0x1b;
		}
		else {
			X0 <<= 1;
		}
	}

	if (t & 0x1) {
		Z0 ^= X0;
	}

#ifdef L_ENDIAN
	*(result) = BSWAP64(Z0);
#else
	*(result) = Z0;
#endif
}